

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_reader.hpp
# Opt level: O3

size_t __thiscall FileAndMemReader::fileSize(FileAndMemReader *this)

{
  FILE *pFVar1;
  long pos;
  size_t sVar2;
  
  pFVar1 = (FILE *)this->m_fp;
  if (this->m_mp == (void *)0x0 && pFVar1 == (FILE *)0x0) {
    sVar2 = 0;
  }
  else if (pFVar1 == (FILE *)0x0) {
    sVar2 = this->m_mp_size;
  }
  else {
    pos = ftell(pFVar1);
    sVar2 = 0;
    seek(this,0,2);
    pFVar1 = (FILE *)this->m_fp;
    if (this->m_mp != (void *)0x0 || pFVar1 != (FILE *)0x0) {
      if (pFVar1 == (FILE *)0x0) {
        sVar2 = this->m_mp_tell;
      }
      else {
        sVar2 = ftell(pFVar1);
      }
    }
    seek(this,pos,0);
  }
  return sVar2;
}

Assistant:

size_t fileSize()
    {
        if(!this->isValid())
            return 0;
        if(!m_fp)
            return m_mp_size; //Size of memory block is well known
        size_t old_pos = this->tell();
        seek(0l, FileAndMemReader::END);
        size_t file_size = this->tell();
        seek(static_cast<long>(old_pos), FileAndMemReader::SET);
        return file_size;
    }